

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O2

base_learner * boosting_setup(options_i *options,vw *all)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  option_group_definition *poVar4;
  typed_option<float> *ptVar5;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ptVar6;
  ostream *poVar7;
  base_learner *pbVar8;
  single_learner *psVar9;
  learner<boosting,_example> *plVar10;
  code *pcVar11;
  undefined8 uVar12;
  vw_exception *this;
  undefined8 uVar13;
  free_ptr<boosting> data;
  allocator local_62f;
  allocator local_62e;
  allocator local_62d;
  allocator local_62c;
  allocator local_62b;
  allocator local_62a;
  allocator local_629;
  string local_628 [32];
  string local_608 [32];
  string local_5e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  string local_528;
  option_group_definition new_options;
  typed_option<float> local_4d0;
  stringstream __msg;
  undefined1 local_420 [96];
  bool local_3c0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a8;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  typed_option<float> local_168;
  typed_option<int> local_c8;
  
  scoped_calloc_or_throw<boosting>();
  std::__cxx11::string::string((string *)&local_548,"Boosting",(allocator *)&__msg);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_548);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::string((string *)&local_568,"boosting",&local_629);
  VW::config::typed_option<int>::typed_option
            ((typed_option<int> *)&__msg,&local_568,
             &(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->N);
  local_3c0 = true;
  std::__cxx11::string::string(local_608,"Online boosting with <N> weak learners",&local_62a);
  std::__cxx11::string::_M_assign((string *)(local_420 + 0x20));
  VW::config::typed_option<int>::typed_option(&local_c8,(typed_option<int> *)&__msg);
  poVar4 = VW::config::option_group_definition::add<int>(&new_options,&local_c8);
  std::__cxx11::string::string((string *)&local_588,"gamma",&local_62b);
  VW::config::typed_option<float>::typed_option
            (&local_4d0,&local_588,
             &(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->gamma);
  ptVar5 = VW::config::typed_option<float>::default_value(&local_4d0,0.1);
  std::__cxx11::string::string
            (local_628,"weak learner\'s edge (=0.1), used only by online BBM",&local_62c);
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_168,ptVar5);
  poVar4 = VW::config::option_group_definition::add<float>(poVar4,&local_168);
  std::__cxx11::string::string((string *)&local_5a8,"alg",&local_62d);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_2a8,&local_5a8,
               &(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->alg);
  local_2a8.super_base_option.m_keep = true;
  std::__cxx11::string::string((string *)&local_5c8,"BBM",&local_62e);
  ptVar6 = VW::config::
           typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::default_value(&local_2a8,&local_5c8);
  std::__cxx11::string::string
            (local_5e8,
             "specify the boosting algorithm: BBM (default), logistic (AdaBoost.OL.W), adaptive (AdaBoost.OL)"
             ,&local_62f);
  std::__cxx11::string::_M_assign((string *)&(ptVar6->super_base_option).m_help);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_208,ptVar6);
  VW::config::option_group_definition::add<std::__cxx11::string>(poVar4,&local_208);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_208);
  std::__cxx11::string::~string(local_5e8);
  std::__cxx11::string::~string((string *)&local_5c8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_2a8);
  std::__cxx11::string::~string((string *)&local_5a8);
  VW::config::typed_option<float>::~typed_option(&local_168);
  std::__cxx11::string::~string(local_628);
  VW::config::typed_option<float>::~typed_option(&local_4d0);
  std::__cxx11::string::~string((string *)&local_588);
  VW::config::typed_option<int>::~typed_option(&local_c8);
  std::__cxx11::string::~string(local_608);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)&__msg);
  std::__cxx11::string::~string((string *)&local_568);
  (**options->_vptr_options_i)(options,&new_options);
  std::__cxx11::string::string((string *)&__msg,"boosting",(allocator *)&local_4d0);
  iVar3 = (*options->_vptr_options_i[1])(options,&__msg);
  std::__cxx11::string::~string((string *)&__msg);
  if ((char)iVar3 == '\0') {
    plVar10 = (learner<boosting,_example> *)0x0;
  }
  else {
    bVar1 = all->quiet;
    if ((bool)bVar1 == false) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Number of weak learners = ");
      poVar7 = (ostream *)
               std::ostream::operator<<
                         (poVar7,(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                                  super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                                  super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->N);
      std::endl<char,std::char_traits<char>>(poVar7);
      bVar1 = all->quiet;
    }
    if ((bVar1 & 1) == 0) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"Gamma = ");
      poVar7 = (ostream *)
               std::ostream::operator<<
                         (poVar7,(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                                  super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                                  super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->gamma);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    iVar3 = (data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
             super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
             super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->N;
    local_2a8.super_base_option._vptr_base_option = (_func_int **)0xffffffffffffffff;
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)&local_4d0,(long)iVar3,
               (value_type_conflict6 *)&local_2a8,(allocator_type *)local_608);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              *)&__msg,(long)iVar3,(value_type *)&local_4d0,(allocator_type *)local_628);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::_M_move_assign(&(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                       super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                       super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->C,&__msg);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               *)&__msg);
    std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              ((_Vector_base<long,_std::allocator<long>_> *)&local_4d0);
    (data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.super__Head_base<0UL,_boosting_*,_false>.
    _M_head_impl)->t = 0;
    (data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.super__Head_base<0UL,_boosting_*,_false>.
    _M_head_impl)->all = all;
    local_4d0.super_base_option._vptr_base_option._0_4_ = 0;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&__msg,
               (long)(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                      super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                      super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->N,
               (value_type_conflict4 *)&local_4d0,(allocator_type *)&local_2a8);
    std::vector<float,_std::allocator<float>_>::_M_move_assign
              (&(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->alpha,&__msg);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&__msg);
    local_4d0.super_base_option._vptr_base_option._0_4_ = 0x3f800000;
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)&__msg,
               (long)(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                      super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                      super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->N,
               (value_type_conflict4 *)&local_4d0,(allocator_type *)&local_2a8);
    std::vector<float,_std::allocator<float>_>::_M_move_assign
              (&(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->v,&__msg);
    std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
              ((_Vector_base<float,_std::allocator<float>_> *)&__msg);
    bVar2 = std::operator==(&(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                              super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                              super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->alg,"BBM");
    if (bVar2) {
      pbVar8 = setup_base(options,all);
      psVar9 = LEARNER::as_singleline<char,char>(pbVar8);
      plVar10 = LEARNER::init_learner<boosting,example,LEARNER::learner<char,example>>
                          (&data,psVar9,predict_or_learn<true>,predict_or_learn<false>,
                           (long)(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                                  super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                                  super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->N);
      uVar12 = *(undefined8 *)(plVar10 + 0x18);
      uVar13 = *(undefined8 *)(plVar10 + 0x20);
    }
    else {
      bVar2 = std::operator==(&(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                                super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                                super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->alg,
                              "logistic");
      if (bVar2) {
        pbVar8 = setup_base(options,all);
        psVar9 = LEARNER::as_singleline<char,char>(pbVar8);
        plVar10 = LEARNER::init_learner<boosting,example,LEARNER::learner<char,example>>
                            (&data,psVar9,predict_or_learn_logistic<true>,
                             predict_or_learn_logistic<false>,
                             (long)(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t
                                    .super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                                    super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->N);
        pcVar11 = save_load;
      }
      else {
        bVar2 = std::operator==(&(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                                  super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                                  super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->alg,
                                "adaptive");
        if (!bVar2) {
          std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
          poVar7 = std::operator<<((ostream *)local_420,"Unrecognized boosting algorithm: \'");
          poVar7 = std::operator<<(poVar7,(string *)
                                          &(data._M_t.
                                            super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t.
                                            super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                                            super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->
                                           alg);
          std::operator<<(poVar7,"\' Bailing!");
          this = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (this,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/boosting.cc"
                     ,0x1c3,&local_528);
          __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        pbVar8 = setup_base(options,all);
        psVar9 = LEARNER::as_singleline<char,char>(pbVar8);
        plVar10 = LEARNER::init_learner<boosting,example,LEARNER::learner<char,example>>
                            (&data,psVar9,predict_or_learn_adaptive<true>,
                             predict_or_learn_adaptive<false>,
                             (long)(data._M_t.super___uniq_ptr_impl<boosting,_void_(*)(void_*)>._M_t
                                    .super__Tuple_impl<0UL,_boosting_*,_void_(*)(void_*)>.
                                    super__Head_base<0UL,_boosting_*,_false>._M_head_impl)->N);
        pcVar11 = save_load_sampling;
      }
      *(code **)(plVar10 + 0x80) = pcVar11;
      uVar12 = *(undefined8 *)(plVar10 + 0x18);
      uVar13 = *(undefined8 *)(plVar10 + 0x20);
      *(undefined8 *)(plVar10 + 0x70) = uVar12;
      *(undefined8 *)(plVar10 + 0x78) = uVar13;
    }
    *(undefined8 *)(plVar10 + 0xb8) = uVar12;
    *(undefined8 *)(plVar10 + 0xc0) = uVar13;
    *(code **)(plVar10 + 200) = finish;
    *(undefined8 *)(plVar10 + 0x58) = uVar12;
    *(code **)(plVar10 + 0x68) = return_example;
  }
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::unique_ptr<boosting,_void_(*)(void_*)>::~unique_ptr(&data);
  return (base_learner *)plVar10;
}

Assistant:

LEARNER::base_learner* boosting_setup(options_i& options, vw& all)
{
  free_ptr<boosting> data = scoped_calloc_or_throw<boosting>();
  option_group_definition new_options("Boosting");
  new_options.add(make_option("boosting", data->N).keep().help("Online boosting with <N> weak learners"))
      .add(make_option("gamma", data->gamma)
               .default_value(0.1f)
               .help("weak learner's edge (=0.1), used only by online BBM"))
      .add(
          make_option("alg", data->alg)
              .keep()
              .default_value("BBM")
              .help("specify the boosting algorithm: BBM (default), logistic (AdaBoost.OL.W), adaptive (AdaBoost.OL)"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("boosting"))
    return nullptr;

  // Description of options:
  // "BBM" implements online BBM (Algorithm 1 in BLK'15)
  // "logistic" implements AdaBoost.OL.W (importance weighted version
  // 	    of Algorithm 2 in BLK'15)
  // "adaptive" implements AdaBoost.OL (Algorithm 2 in BLK'15,
  // 	    using sampling rather than importance weighting)

  if (!all.quiet)
    cerr << "Number of weak learners = " << data->N << endl;
  if (!all.quiet)
    cerr << "Gamma = " << data->gamma << endl;

  data->C = std::vector<std::vector<int64_t> >(data->N, std::vector<int64_t>(data->N, -1));
  data->t = 0;
  data->all = &all;
  data->alpha = std::vector<float>(data->N, 0);
  data->v = std::vector<float>(data->N, 1);

  learner<boosting, example>* l;
  if (data->alg == "BBM")
    l = &init_learner<boosting, example>(
        data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>, data->N);
  else if (data->alg == "logistic")
  {
    l = &init_learner<boosting, example>(data, as_singleline(setup_base(options, all)), predict_or_learn_logistic<true>,
        predict_or_learn_logistic<false>, data->N);
    l->set_save_load(save_load);
  }
  else if (data->alg == "adaptive")
  {
    l = &init_learner<boosting, example>(data, as_singleline(setup_base(options, all)), predict_or_learn_adaptive<true>,
        predict_or_learn_adaptive<false>, data->N);
    l->set_save_load(save_load_sampling);
  }
  else
    THROW("Unrecognized boosting algorithm: \'" << data->alg << "\' Bailing!");

  l->set_finish(finish);
  l->set_finish_example(return_example);

  return make_base(*l);
}